

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_mutex.c
# Opt level: O0

uint s_mutex_cancel_dead_waiting_tasks_(void)

{
  s_list_t *psVar1;
  s_mutex_t *list;
  s_mutex_t *psVar2;
  long *in_FS_OFFSET;
  s_task_t *task;
  s_mutex_t *mutex;
  s_list_t *this_task;
  s_list_t *next_task;
  s_list_t *psStack_18;
  uint ret;
  s_list_t *this_mutex;
  s_list_t *next_mutex;
  
  next_task._4_4_ = 0;
  psStack_18 = s_list_get_next((s_list_t *)(*in_FS_OFFSET + -0x20));
  while (psStack_18 != (s_list_t *)(*in_FS_OFFSET + -0x20)) {
    psVar1 = s_list_get_next(psStack_18);
    s_list_detach(psStack_18);
    list = (s_mutex_t *)(psStack_18 + -1);
    mutex = (s_mutex_t *)s_list_get_next((s_list_t *)list);
    while (psStack_18 = psVar1, mutex != list) {
      psVar2 = (s_mutex_t *)s_list_get_next(&mutex->wait_list);
      s_task_cancel_wait(mutex);
      next_task._4_4_ = next_task._4_4_ + 1;
      mutex = psVar2;
    }
  }
  if (next_task._4_4_ != 0) {
    fprintf(_stderr,"error: cancel dead tasks waiting on mutex!\n");
  }
  return next_task._4_4_;
}

Assistant:

unsigned int s_mutex_cancel_dead_waiting_tasks_() {
    s_list_t *next_mutex;
    s_list_t *this_mutex;
    unsigned int ret = 0;
    /* Check all mutexs */
    for(this_mutex = s_list_get_next(&g_globals.waiting_mutexes);
        this_mutex != &g_globals.waiting_mutexes;
        this_mutex = next_mutex) {
        s_list_t *next_task;
        s_list_t *this_task;
        s_mutex_t *mutex;
        
        next_mutex = s_list_get_next(this_mutex);
        s_list_detach(this_mutex);
        mutex = GET_PARENT_ADDR(this_mutex, s_mutex_t, self);
        
        /* Check all tasks blocked on this mutex */
        for(this_task = s_list_get_next(&mutex->wait_list);
            this_task != &mutex->wait_list;
            this_task = next_task) {
            next_task = s_list_get_next(this_task);
                    
            s_task_t *task = GET_PARENT_ADDR(this_task, s_task_t, node);
            s_task_cancel_wait(task);
            ++ret;
        }
    }

#ifndef NDEBUG
    if (ret > 0) {
        fprintf(stderr, "error: cancel dead tasks waiting on mutex!\n");
    }
#endif

    return ret;
}